

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O2

int __thiscall
ON_HistoryRecord::GetSubDEdgeChainValues
          (ON_HistoryRecord *this,int value_id,ON_SimpleArray<const_ON_SubDEdgeChain_*> *a)

{
  uint uVar1;
  ON_Value *pOVar2;
  long lVar3;
  ulong uVar4;
  
  if (-1 < a->m_capacity) {
    a->m_count = 0;
  }
  lVar3 = 0;
  pOVar2 = FindValueHelper(this,value_id,0xe,false);
  if (pOVar2 != (ON_Value *)0x0) {
    uVar1 = *(uint *)&pOVar2[2]._vptr_ON_Value;
    ON_SimpleArray<const_ON_SubDEdgeChain_*>::Reserve(a,(long)(int)uVar1);
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    for (; uVar4 * 8 != lVar3; lVar3 = lVar3 + 8) {
      ON_SimpleArray<const_ON_SubDEdgeChain_*>::Append
                (a,(ON_SubDEdgeChain **)(*(long *)&pOVar2[1].m_value_id + lVar3));
    }
  }
  return a->m_count;
}

Assistant:

int ON_HistoryRecord::GetSubDEdgeChainValues(int value_id, ON_SimpleArray<const ON_SubDEdgeChain*>& a) const
{
  a.SetCount(0);
  const ON_SubDEdgeChainHistoryValue* v = static_cast<ON_SubDEdgeChainHistoryValue*>(FindValueHelper(value_id, ON_Value::subd_edge_chain_value, 0));
  if (v)
  {
    int i, count = v->m_value.Count();
    a.Reserve(count);
    for (i = 0; i < count; i++)
      a.Append(v->m_value[i]);
  }
  return a.Count();
}